

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int listlocals(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  TString *local_38;
  TString *usertype;
  char *pcStack_28;
  ravi_type_map tt;
  char *name;
  int i;
  int pc;
  Proto *p;
  lua_State *L_local;
  
  p = (Proto *)L;
  lVar2 = luaL_checkinteger(L,2);
  name._4_4_ = (int)lVar2 + -1;
  name._0_4_ = 0;
  iVar1 = lua_type((lua_State *)p,1);
  if (iVar1 == 6) {
    iVar1 = lua_iscfunction((lua_State *)p,1);
    if (iVar1 == 0) goto LAB_00185d02;
  }
  luaL_argerror((lua_State *)p,1,"Lua function expected");
LAB_00185d02:
  if (*(short *)(**(long **)&p->sizep + 0x18) != -0x7ffa) {
    __assert_fail("(((((L->ci->func + (1))))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x28b,"int listlocals(lua_State *)");
  }
  if (*(char *)(*(long *)(**(long **)&p->sizep + 0x10) + 8) == '\x06') {
    _i = *(Proto **)(*(long *)(**(long **)&p->sizep + 0x10) + 0x18);
    while( true ) {
      name._0_4_ = (int)name + 1;
      pcStack_28 = luaF_getlocalname(_i,(int)name,name._4_4_,(ravi_type_map *)((long)&usertype + 4),
                                     &local_38);
      if (pcStack_28 == (char *)0x0) break;
      lua_pushstring((lua_State *)p,pcStack_28);
    }
    return (int)name + -1;
  }
  __assert_fail("((((L->ci->func + (1)))->value_).gc)->tt == ((6) | ((0) << 4))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x28b,"int listlocals(lua_State *)");
}

Assistant:

static int listlocals (lua_State *L) {
  Proto *p;
  int pc = cast_int(luaL_checkinteger(L, 2)) - 1;
  int i = 0;
  const char *name;
  ravi_type_map tt;
  TString *usertype;
  luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1),
                 1, "Lua function expected");
  p = getproto(obj_at(L, 1));
  while ((name = luaF_getlocalname(p, ++i, pc, &tt, &usertype)) != NULL)
    lua_pushstring(L, name);
  return i-1;
}